

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O0

int sfi::logic::getBase(string *addr)

{
  bool bVar1;
  long lVar2;
  istream *piVar3;
  size_type sVar4;
  reference pvVar5;
  reference pcVar6;
  ulong uVar7;
  char *a;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string tmp;
  int local_1e8;
  int digit;
  int max;
  string octet;
  istringstream local_1b0 [8];
  istringstream ss;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  string *addr_local;
  
  octets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = addr;
  lVar2 = std::__cxx11::string::find((char)addr,0x78);
  if (lVar2 != -1) {
    return 0x10;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  std::__cxx11::istringstream::istringstream
            (local_1b0,
             octets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,8);
  std::__cxx11::string::string((string *)&max);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&max,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30,(value_type *)&max);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
  if (1 < sVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30,0);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 8) {
      addr_local._4_4_ = 2;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30,0);
      lVar2 = std::__cxx11::string::length();
      if (lVar2 == 4) {
        addr_local._4_4_ = 8;
      }
      else {
        addr_local._4_4_ = 10;
      }
    }
    goto LAB_0010ab1b;
  }
  local_1e8 = 0;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_30,0);
  std::__cxx11::string::string((string *)&__range3,(string *)pvVar5);
  __end3._M_current = (char *)std::__cxx11::string::begin();
  a = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&a), bVar1) {
    pcVar6 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
    if (local_1e8 < *pcVar6 + -0x30) {
      local_1e8 = *pcVar6 + -0x30;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end3);
  }
  if (local_1e8 < 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30,0);
    uVar7 = std::__cxx11::string::size();
    if (uVar7 < 0x15) goto LAB_0010aac7;
    addr_local._4_4_ = 2;
  }
  else {
LAB_0010aac7:
    if (local_1e8 < 8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30,0);
      lVar2 = std::__cxx11::string::size();
      if (lVar2 == 0xc) {
        addr_local._4_4_ = 8;
        goto LAB_0010ab0f;
      }
    }
    addr_local._4_4_ = 10;
  }
LAB_0010ab0f:
  std::__cxx11::string::~string((string *)&__range3);
LAB_0010ab1b:
  std::__cxx11::string::~string((string *)&max);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return addr_local._4_4_;
}

Assistant:

static int sfi::logic::getBase(const string& addr) {
    if (addr.find('x') != -1) {
        return 16;
    } else {

        vector<string> octets;
        istringstream ss(addr);
        string octet;
        while (getline(ss, octet, '.')) {
            octets.push_back(octet);
        }
        if (octets.size() > 1) {
//            for (const auto &o : octets) {
                if (octets[0].length() == 8)
                    return 2;
                else if (octets[0].length() == 4)
                    return 8;
                else
                    return 10;

//            }
        } else {
            int max =0 ;
            int digit;
            string tmp = octets[0];
            for (const auto& a : tmp) {
                digit = a - '0';
                if (digit > max) {
                    max = digit;
                }
            }
            if (max < 2 && octets[0].size() > 20){
                return 2;
            } else if (max < 8 && octets[0].size() == 12) {
                return 8;
            } else {
                return 10;
            }
        }
    }
}